

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O1

void __thiscall CVmUndo::gc_remove_stale_weak_refs(CVmUndo *this)

{
  CVmObjPageEntry *pCVar1;
  uint uVar2;
  CVmUndoMeta *pCVar3;
  CVmUndoMeta *pCVar4;
  CVmUndoMeta *pCVar5;
  
  pCVar3 = this->oldest_first_;
  pCVar4 = pCVar3;
  if (pCVar3 != (CVmUndoMeta *)0x0) {
    do {
      if (pCVar4 == pCVar3) {
        pCVar3 = (pCVar4->link).next_first;
      }
      else {
        uVar2 = (pCVar4->rec).obj;
        if (uVar2 != 0) {
          if ((*(ushort *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].field_0x14 & 0x3c) ==
              0x20 || (*(ushort *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].field_0x14 & 1)
                      != 0) {
            (pCVar4->rec).obj = 0;
          }
          else if ((G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].field_0x15 & 4) != 0) {
            pCVar1 = G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff);
            (**(code **)(*(long *)&pCVar1->ptr_ + 0xb8))(pCVar1,pCVar4);
          }
        }
      }
      pCVar5 = pCVar4 + 1;
      if (pCVar4 + 1 == this->rec_arr_ + this->rec_arr_size_) {
        pCVar5 = this->rec_arr_;
      }
      pCVar4 = pCVar5;
    } while (pCVar5 != this->next_free_);
  }
  return;
}

Assistant:

void CVmUndo::gc_remove_stale_weak_refs(VMG0_)
{
    CVmUndoMeta *cur;
    CVmUndoMeta *next_link;

    /* if we don't have any records, there's nothing to do */
    if (oldest_first_ == 0)
        return;

    /* the first record is a linking record */
    next_link = oldest_first_;

    /* start at the first record */
    cur = oldest_first_;

    /* 
     *   Go through all undo records, from the oldest to the newest.  Note
     *   that we must keep track of each "link" record, because these are
     *   not ordinary undo records and must be handled differently.  
     */
    for (;;)
    {
        /* check to see if this is a linking record or an ordinary record */
        if (cur == next_link)
        {
            /* 
             *   this is a linking record - simply note the next linking
             *   record and otherwise ignore this record 
             */
            next_link = cur->link.next_first;
        }
        else if (cur->rec.obj != VM_INVALID_OBJ)
        {
            /* 
             *   It's an ordinary undo record -- delete its stale
             *   references.  If the record owner is itself about to be
             *   deleted, don't bother with the object, but rather delete
             *   the entire undo record -- undo records themselves only
             *   weakly reference their owning objects.  
             */
            if (!G_obj_table->is_obj_deletable(cur->rec.obj))
            {
                /* it's not ready for deletion - clean up its weak refs */
                G_obj_table->remove_obj_stale_undo_weak_ref(
                    vmg_ cur->rec.obj, &cur->rec);
            }
            else
            {
                /* 
                 *   it's no longer reachable - delete the undo record by
                 *   setting the owning object to 'invalid' 
                 */
                cur->rec.obj = VM_INVALID_OBJ;
            }
        }

        /* advance to the next record, wrapping at the end of the array */
        ++cur;
        if (cur == rec_arr_ + rec_arr_size_)
            cur = rec_arr_;

        /* stop if we've reached the last record */
        if (cur == next_free_)
            break;
    }
}